

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lyd_parser_check_schema(lyd_ctx *lydctx,lysc_node *snode)

{
  lyd_node *plVar1;
  ly_ctx *plVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  LY_ERR local_1c;
  LY_ERR rc;
  lysc_node *snode_local;
  lyd_ctx *lydctx_local;
  
  local_1c = LY_SUCCESS;
  ly_log_location(snode,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
  if ((lydctx->int_opts & 0x10) != 0) goto LAB_001a7e15;
  if (((lydctx->parse_opts & 0x80000) != 0) && ((snode->flags & 2) != 0)) {
    ly_vlog(lydctx->data_ctx->ctx,(char *)0x0,LYVE_DATA,"Unexpected data %s node \"%s\" found.",
            "state",snode->name);
    local_1c = LY_EVALID;
    goto LAB_001a7e15;
  }
  if (snode->nodetype == 0x100) {
    if ((lydctx->int_opts & 5) != 0) {
      plVar1 = lydctx->op_node;
joined_r0x001a7d24:
      if (plVar1 != (lyd_node *)0x0) {
        plVar2 = lydctx->data_ctx->ctx;
        pcVar3 = lys_nodetype2str(snode->nodetype);
        pcVar5 = snode->name;
        pcVar4 = lys_nodetype2str(lydctx->op_node->schema->nodetype);
        ly_vlog(plVar2,(char *)0x0,LYVE_DATA,
                "Unexpected %s element \"%s\", %s \"%s\" already parsed.",pcVar3,pcVar5,pcVar4,
                lydctx->op_node->schema->name);
        local_1c = LY_EVALID;
      }
      goto LAB_001a7e15;
    }
  }
  else if (snode->nodetype == 0x200) {
    if ((lydctx->int_opts & 6) != 0) {
      plVar1 = lydctx->op_node;
      goto joined_r0x001a7d24;
    }
  }
  else {
    if (snode->nodetype != 0x400) goto LAB_001a7e15;
    if ((lydctx->int_opts & 8) != 0) {
      plVar1 = lydctx->op_node;
      goto joined_r0x001a7d24;
    }
  }
  plVar2 = lydctx->data_ctx->ctx;
  pcVar5 = lys_nodetype2str(snode->nodetype);
  ly_vlog(plVar2,(char *)0x0,LYVE_DATA,"Unexpected %s element \"%s\".",pcVar5,snode->name);
  local_1c = LY_EVALID;
LAB_001a7e15:
  ly_log_location_revert(1,0,0,0);
  return local_1c;
}

Assistant:

LY_ERR
lyd_parser_check_schema(struct lyd_ctx *lydctx, const struct lysc_node *snode)
{
    LY_ERR rc = LY_SUCCESS;

    LOG_LOCSET(snode, NULL);

    if (lydctx->int_opts & LYD_INTOPT_ANY) {
        /* nothing to check, everything is allowed */
        goto cleanup;
    }

    if ((lydctx->parse_opts & LYD_PARSE_NO_STATE) && (snode->flags & LYS_CONFIG_R)) {
        LOGVAL(lydctx->data_ctx->ctx, LY_VCODE_UNEXPNODE, "state", snode->name);
        rc = LY_EVALID;
        goto cleanup;
    }

    if (snode->nodetype == LYS_RPC) {
        if (lydctx->int_opts & (LYD_INTOPT_RPC | LYD_INTOPT_REPLY)) {
            if (lydctx->op_node) {
                goto error_node_dup;
            }
        } else {
            goto error_node_inval;
        }
    } else if (snode->nodetype == LYS_ACTION) {
        if (lydctx->int_opts & (LYD_INTOPT_ACTION | LYD_INTOPT_REPLY)) {
            if (lydctx->op_node) {
                goto error_node_dup;
            }
        } else {
            goto error_node_inval;
        }
    } else if (snode->nodetype == LYS_NOTIF) {
        if (lydctx->int_opts & LYD_INTOPT_NOTIF) {
            if (lydctx->op_node) {
                goto error_node_dup;
            }
        } else {
            goto error_node_inval;
        }
    }

    /* success */
    goto cleanup;

error_node_dup:
    LOGVAL(lydctx->data_ctx->ctx, LYVE_DATA, "Unexpected %s element \"%s\", %s \"%s\" already parsed.",
            lys_nodetype2str(snode->nodetype), snode->name, lys_nodetype2str(lydctx->op_node->schema->nodetype),
            lydctx->op_node->schema->name);
    rc = LY_EVALID;
    goto cleanup;

error_node_inval:
    LOGVAL(lydctx->data_ctx->ctx, LYVE_DATA, "Unexpected %s element \"%s\".", lys_nodetype2str(snode->nodetype),
            snode->name);
    rc = LY_EVALID;

cleanup:
    LOG_LOCBACK(1, 0);
    return rc;
}